

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall leveldb::log::LogTest::Write(LogTest *this,string *msg)

{
  AssertHelper *this_00;
  undefined8 *puVar1;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  internal local_58 [8];
  undefined8 *local_50;
  undefined1 local_48 [16];
  string local_38;
  
  local_58[0] = (internal)(this->reading_ ^ 1);
  local_50 = (undefined8 *)0x0;
  if (this->reading_ == false) {
    local_38._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
    local_38._M_string_length = msg->_M_string_length;
    Writer::AddRecord((Writer *)local_48,(Slice *)this->writer_);
    if ((WritableFile *)local_48._0_8_ != (WritableFile *)0x0) {
      operator_delete__((void *)local_48._0_8_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),"Write() after starting to read",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)"!reading_","false","true",in_R9);
    this_00 = (AssertHelper *)(local_48 + 8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x3a,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(this_00,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
    puVar1 = local_50;
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar1);
    }
  }
  return;
}

Assistant:

void Write(const std::string& msg) {
    ASSERT_TRUE(!reading_) << "Write() after starting to read";
    writer_->AddRecord(Slice(msg));
  }